

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::CWriter::MangleName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name)

{
  CWriter CVar1;
  int iVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar3;
  int iVar4;
  char *pcVar5;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"Z_","",name.size_);
  psVar3 = extraout_RAX;
  if (name.data_ != (char *)0x0) {
    pcVar5 = (char *)0x0;
    do {
      CVar1 = this[(long)pcVar5];
      iVar4 = (int)(char)CVar1;
      iVar2 = isalnum(iVar4);
      if ((iVar4 == 0x5f) || (iVar4 != 0x5a && iVar2 != 0)) {
        psVar3 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        StringPrintf_abi_cxx11_(&local_50,"%02X",(ulong)(byte)CVar1);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        psVar3 = (string *)&local_50.field_2;
        if ((string *)local_50._M_dataplus._M_p != psVar3) {
          operator_delete(local_50._M_dataplus._M_p);
          psVar3 = extraout_RAX_00;
        }
      }
      pcVar5 = pcVar5 + 1;
    } while (name.data_ != pcVar5);
  }
  return psVar3;
}

Assistant:

std::string CWriter::MangleName(string_view name) {
  const char kPrefix = 'Z';
  std::string result = "Z_";

  if (!name.empty()) {
    for (char c : name) {
      if ((isalnum(c) && c != kPrefix) || c == '_') {
        result += c;
      } else {
        result += kPrefix;
        result += StringPrintf("%02X", static_cast<uint8_t>(c));
      }
    }
  }

  return result;
}